

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

QList<QUrl> * __thiscall
QFileDialogPrivate::userSelectedFiles(QList<QUrl> *__return_storage_ptr__,QFileDialogPrivate *this)

{
  Ui_QFileDialog *pUVar1;
  long *plVar2;
  Data *pDVar3;
  QUrl *pQVar4;
  qsizetype qVar5;
  QPlatformDialogHelper *pQVar6;
  QString *path;
  long lVar7;
  QModelIndex *index;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QArrayDataPointer<QString> local_b8;
  QUrl local_a0;
  QArrayData *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QArrayDataPointer<QUrl> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QUrl *)0x0;
  local_78.size = 0;
  pUVar1 = (this->qFileDialogUi).d;
  if ((pUVar1 == (Ui_QFileDialog *)0x0 | (this->super_QDialogPrivate).nativeDialogInUse) == 1) {
    pQVar6 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
    if (pQVar6 == (QPlatformDialogHelper *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
    }
    else {
      (**(code **)(*(long *)pQVar6 + 0xa0))(&local_58,pQVar6);
    }
    addDefaultSuffixToUrls(__return_storage_ptr__,this,(QList<QUrl> *)&local_58);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
  }
  else {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::selectionModel((QAbstractItemView *)pUVar1->listView);
    QItemSelectionModel::selectedRows((int)&local_98);
    QList<QUrl>::reserve((QList<QUrl> *)&local_78,(qsizetype)local_88);
    if (local_88 != (undefined1 *)0x0) {
      lVar7 = (long)local_88 * 0x18;
      puVar8 = puStack_90;
      do {
        plVar2 = *(long **)(puVar8 + 0x10);
        if (plVar2 == (long *)0x0) {
          local_58.shared = (PrivateShared *)0x0;
          local_58._8_8_ = 0;
          local_58._16_8_ = 0;
          local_40 = 2;
        }
        else {
          (**(code **)(*plVar2 + 0x90))(&local_58,plVar2,puVar8,0x101);
        }
        ::QVariant::toString();
        QUrl::fromLocalFile((QString *)&local_a0);
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                  ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_a0);
        QList<QUrl>::end((QList<QUrl> *)&local_78);
        QUrl::~QUrl(&local_a0);
        if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d)->super_QArrayData,2,0x10);
          }
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
        puVar8 = puVar8 + 0x18;
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    if (local_78.size == 0) {
      QLineEdit::text((QString *)&local_58,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit
                     );
      bVar9 = local_58._16_8_ != 0;
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
    }
    else {
      bVar9 = false;
    }
    if (bVar9) {
      local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      typedFiles((QStringList *)&local_b8,this);
      QList<QUrl>::reserve((QList<QUrl> *)&local_78,local_b8.size);
      if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
        lVar7 = local_b8.size * 0x18;
        do {
          QUrl::fromLocalFile((QString *)&local_a0);
          QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                    ((QMovableArrayOps<QUrl> *)&local_78,local_78.size,&local_a0);
          QList<QUrl>::end((QList<QUrl> *)&local_78);
          QUrl::~QUrl(&local_a0);
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
    }
    qVar5 = local_78.size;
    pQVar4 = local_78.ptr;
    pDVar3 = local_78.d;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QUrl *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pQVar4;
    local_78.size = 0;
    (__return_storage_ptr__->d).size = qVar5;
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,0x18,0x10);
      }
    }
  }
  QArrayDataPointer<QUrl>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QUrl> QFileDialogPrivate::userSelectedFiles() const
{
    QList<QUrl> files;

    if (!usingWidgets())
        return addDefaultSuffixToUrls(selectedFiles_sys());

    const QModelIndexList selectedRows = qFileDialogUi->listView->selectionModel()->selectedRows();
    files.reserve(selectedRows.size());
    for (const QModelIndex &index : selectedRows)
        files.append(QUrl::fromLocalFile(index.data(QFileSystemModel::FilePathRole).toString()));

    if (files.isEmpty() && !lineEdit()->text().isEmpty()) {
        const QStringList typedFilesList = typedFiles();
        files.reserve(typedFilesList.size());
        for (const QString &path : typedFilesList)
            files.append(QUrl::fromLocalFile(path));
    }

    return files;
}